

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O0

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> * __thiscall
vk::SimpleAllocator::allocate
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          SimpleAllocator *this,VkMemoryAllocateInfo *allocInfo,VkDeviceSize alignment)

{
  DeviceInterface *vkd;
  VkDevice device;
  PtrData<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  data;
  bool bVar1;
  HostPtr *this_00;
  Handle<(vk::HandleType)7> *pHVar2;
  SimpleAllocation *this_01;
  undefined4 uVar3;
  undefined1 in_stack_fffffffffffffedc [12];
  DefaultDeleter<vk::Allocation> local_ca;
  undefined1 local_c9;
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_c8;
  Move<vk::Handle<(vk::HandleType)7>_> local_b8;
  DefaultDeleter<vk::(anonymous_namespace)::HostPtr> local_91;
  deUint64 local_90;
  PtrData<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_88;
  PtrData<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  *local_78;
  undefined1 local_58 [8];
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  hostPtr;
  Move<vk::Handle<(vk::HandleType)7>_> mem;
  VkDeviceSize alignment_local;
  VkMemoryAllocateInfo *allocInfo_local;
  SimpleAllocator *this_local;
  
  allocateMemory((Move<vk::Handle<(vk::HandleType)7>_> *)
                 &hostPtr.
                  super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                  .m_data.field_0x8,this->m_vk,this->m_device,allocInfo,(VkAllocationCallbacks *)0x0
                );
  de::details::
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::MovePtr((MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
             *)local_58);
  bVar1 = anon_unknown_5::isHostVisibleMemory(&this->m_memProps,allocInfo->memoryTypeIndex);
  if (bVar1) {
    this_00 = (HostPtr *)operator_new(0x20);
    vkd = this->m_vk;
    device = this->m_device;
    pHVar2 = refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)7>_> *)
                        &hostPtr.
                         super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                         .m_data.field_0x8);
    local_90 = pHVar2->m_internal;
    uVar3 = 0;
    anon_unknown_5::HostPtr::HostPtr
              (this_00,vkd,device,(VkDeviceMemory)local_90,0,allocInfo->allocationSize,0);
    de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>::DefaultDeleter(&local_91);
    de::details::
    MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
    ::MovePtr((MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
               *)&local_88);
    local_78 = de::details::MovePtr::operator_cast_to_PtrData(&local_88,(MovePtr *)this_00);
    data._4_12_ = in_stack_fffffffffffffedc;
    data.ptr._0_4_ = uVar3;
    de::details::
    MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
    ::operator=((MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                 *)local_58,data);
    de::details::
    MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
    ::~MovePtr((MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                *)&local_88);
  }
  this_01 = (SimpleAllocation *)operator_new(0x50);
  local_c9 = 1;
  refdetails::Move<vk::Handle<(vk::HandleType)7>_>::Move
            (&local_b8,
             (Move<vk::Handle<(vk::HandleType)7>_> *)
             &hostPtr.
              super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
              .m_data.field_0x8);
  de::details::
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::MovePtr(&local_c8,
            (MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
             *)local_58);
  SimpleAllocation::SimpleAllocation(this_01,&local_b8,&local_c8);
  local_c9 = 0;
  de::DefaultDeleter<vk::Allocation>::DefaultDeleter(&local_ca);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (__return_storage_ptr__,this_01);
  de::details::
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::~MovePtr(&local_c8);
  refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_b8);
  de::details::
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::~MovePtr((MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
              *)local_58);
  refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)7>_> *)
             &hostPtr.
              super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
              .m_data.field_0x8);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<Allocation> SimpleAllocator::allocate (const VkMemoryAllocateInfo& allocInfo, VkDeviceSize alignment)
{
	DE_UNREF(alignment);

	Move<VkDeviceMemory>	mem		= allocateMemory(m_vk, m_device, &allocInfo);
	MovePtr<HostPtr>		hostPtr;

	if (isHostVisibleMemory(m_memProps, allocInfo.memoryTypeIndex))
		hostPtr = MovePtr<HostPtr>(new HostPtr(m_vk, m_device, *mem, 0u, allocInfo.allocationSize, 0u));

	return MovePtr<Allocation>(new SimpleAllocation(mem, hostPtr));
}